

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::analysis::DefUseManager::WhileEachUse
          (DefUseManager *this,Instruction *def,
          function<bool_(spvtools::opt::Instruction_*,_unsigned_int)> *f)

{
  _Rb_tree_header *p_Var1;
  undefined8 *puVar2;
  byte bVar3;
  bool bVar4;
  uint32_t uVar5;
  const_iterator cVar6;
  Instruction *pIVar7;
  ulong uVar8;
  long lVar9;
  undefined8 *puVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  uint local_54;
  Instruction *local_50;
  _Base_ptr local_48;
  _Base_ptr local_40;
  _Any_data *local_38;
  
  local_38 = (_Any_data *)f;
  if (def != (Instruction *)0x0) {
    bVar3 = def->has_result_id_;
    if ((bool)bVar3 == true) {
      uVar5 = Instruction::GetSingleWordOperand(def,(uint)def->has_type_id_);
      local_50 = (Instruction *)CONCAT44(local_50._4_4_,uVar5);
      cVar6 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)this,(key_type *)&local_50);
      if (cVar6.
          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
          ._M_cur == (__node_type *)0x0) {
        pIVar7 = (Instruction *)0x0;
      }
      else {
        pIVar7 = *(Instruction **)
                  ((long)cVar6.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
                         ._M_cur + 0x10);
      }
      if (pIVar7 != def) goto LAB_0059705f;
      bVar3 = def->has_result_id_;
    }
    if ((bVar3 & 1) != 0) {
      p_Var1 = &(this->id_to_users_)._M_t._M_impl.super__Rb_tree_header;
      local_40 = (_Base_ptr)UsersBegin(this,def);
      local_48 = &p_Var1->_M_header;
      if ((_Rb_tree_header *)local_40 != p_Var1) {
        do {
          if (*(Instruction **)(local_40 + 1) != def) {
            return true;
          }
          pIVar7 = (Instruction *)local_40[1]._M_parent;
          lVar9 = (long)(pIVar7->operands_).
                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          uVar8 = ((long)(pIVar7->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_finish - lVar9 >> 4) *
                  -0x5555555555555555;
          if ((int)uVar8 != 0) {
            uVar12 = 0;
            do {
              uVar11 = (uint)uVar12;
              if (uVar8 <= uVar12) {
                __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                              ,0x2a0,"Operand &spvtools::opt::Instruction::GetOperand(uint32_t)");
              }
              lVar13 = uVar12 * 0x30;
              if ((*(spv_operand_type_t *)(lVar9 + lVar13) != SPV_OPERAND_TYPE_RESULT_ID) &&
                 (bVar4 = spvIsIdType(*(spv_operand_type_t *)(lVar9 + lVar13)), bVar4)) {
                uVar5 = 0;
                if (def->has_result_id_ == true) {
                  uVar5 = Instruction::GetSingleWordOperand(def,(uint)def->has_type_id_);
                }
                puVar2 = *(undefined8 **)(lVar9 + lVar13 + 0x28);
                puVar10 = (undefined8 *)(lVar9 + lVar13 + 0x20);
                if (puVar2 != (undefined8 *)0x0) {
                  puVar10 = puVar2;
                }
                if (uVar5 == *(uint32_t *)*puVar10) {
                  local_54 = uVar11;
                  local_50 = pIVar7;
                  if (*(long *)(local_38 + 1) == 0) {
                    std::__throw_bad_function_call();
                  }
                  bVar4 = (**(code **)(local_38->_M_pod_data + 0x18))(local_38,&local_50,&local_54);
                  if (!bVar4) {
                    return false;
                  }
                }
              }
              uVar12 = (ulong)(uVar11 + 1);
              lVar9 = (long)(pIVar7->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_start;
              uVar8 = ((long)(pIVar7->operands_).
                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                             ._M_impl.super__Vector_impl_data._M_finish - lVar9 >> 4) *
                      -0x5555555555555555;
            } while (uVar11 + 1 != (uint)uVar8);
          }
          local_40 = (_Base_ptr)std::_Rb_tree_increment(local_40);
        } while (local_40 != local_48);
      }
    }
    return true;
  }
LAB_0059705f:
  __assert_fail("def && (!def->HasResultId() || def == GetDef(def->result_id())) && \"Definition is not registered.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/def_use_manager.cpp"
                ,0x97,
                "bool spvtools::opt::analysis::DefUseManager::WhileEachUse(const Instruction *, const std::function<bool (Instruction *, uint32_t)> &) const"
               );
}

Assistant:

bool DefUseManager::WhileEachUse(
    const Instruction* def,
    const std::function<bool(Instruction*, uint32_t)>& f) const {
  // Ensure that |def| has been registered.
  assert(def && (!def->HasResultId() || def == GetDef(def->result_id())) &&
         "Definition is not registered.");
  if (!def->HasResultId()) return true;

  auto end = id_to_users_.end();
  for (auto iter = UsersBegin(def); UsersNotEnd(iter, end, def); ++iter) {
    Instruction* user = iter->user;
    for (uint32_t idx = 0; idx != user->NumOperands(); ++idx) {
      const Operand& op = user->GetOperand(idx);
      if (op.type != SPV_OPERAND_TYPE_RESULT_ID && spvIsIdType(op.type)) {
        if (def->result_id() == op.words[0]) {
          if (!f(user, idx)) return false;
        }
      }
    }
  }
  return true;
}